

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absolute.cpp
# Opt level: O0

string * fs_absolute_abi_cxx11_(string *__return_storage_ptr__,string_view path,bool expand_tilde)

{
  string_view path_00;
  string_view path_01;
  bool bVar1;
  __sv_type path_02;
  string_view local_108;
  size_t local_f8;
  char *pcStack_f0;
  path local_e0;
  undefined1 local_b8 [8];
  path a;
  error_code ec;
  allocator<char> local_59;
  size_t local_58;
  size_t local_50;
  undefined1 local_48 [8];
  string ex;
  undefined1 auStack_20 [7];
  bool expand_tilde_local;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_20 = path._M_len;
  ex.field_2._M_local_buf[0xf] = expand_tilde;
  path_local._M_str = (char *)__return_storage_ptr__;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  if (bVar1) {
    fs_get_cwd_abi_cxx11_();
  }
  else {
    if ((ex.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_48,(basic_string_view<char,_std::char_traits<char>_> *)auStack_20,
                 &local_59);
      std::allocator<char>::~allocator(&local_59);
    }
    else {
      local_58 = _auStack_20;
      local_50 = path_local._M_len;
      path_01._M_str = (char *)path_local._M_len;
      path_01._M_len = _auStack_20;
      fs_expanduser_abi_cxx11_((string *)local_48,path_01);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      path_02 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      bVar1 = fs_is_absolute(path_02);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
      }
      else {
        std::error_code::error_code((error_code *)&a._M_cmpts);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   auto_format);
        std::filesystem::absolute((path *)local_b8,(error_code *)&local_e0);
        std::filesystem::__cxx11::path::~path(&local_e0);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)&a._M_cmpts);
        if (bVar1) {
          local_f8 = _auStack_20;
          pcStack_f0 = (char *)path_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_108,"fs_absolute");
          path_00._M_str = pcStack_f0;
          path_00._M_len = local_f8;
          fs_print_error(path_00,local_108,(error_code *)&a._M_cmpts);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
        }
        else {
          std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,(path *)local_b8);
        }
        std::filesystem::__cxx11::path::~path((path *)local_b8);
      }
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_absolute(std::string_view path, const bool expand_tilde)
{
  // wraps std::filesystem::absolute(path).
  // path need not exist
  // Inspired by Python pathlib.Path.absolute()
  // https://docs.python.org/3/library/pathlib.html#pathlib.Path.absolute

  // Linux, MinGW can't handle empty paths
  if(path.empty())
    return fs_get_cwd();

  const std::string ex = expand_tilde
    ? fs_expanduser(path)
    : std::string(path);

  if (ex.empty()) FFS_UNLIKELY
    return {};

  if (fs_is_absolute(ex))
    return ex;

#ifdef HAVE_CXX_FILESYSTEM
  std::error_code ec;

  const auto a = std::filesystem::absolute(ex, ec);

  if(!ec) FFS_LIKELY
    return a.generic_string();

  fs_print_error(path, __func__, ec);
  return {};
#else
  std::string a = fs_get_cwd();
  if(a.empty())
    return {};

  a.push_back('/');
  a.append(ex);

  // NOT normalized to be consistent with <filesystem>
  return a;
#endif
}